

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O0

geometry_t new_submesh_geometry(scene *scene,mesh *mesh,size_t begin,size_t end)

{
  geometry_t pgVar1;
  undefined1 local_90 [8];
  submesh_geometry submesh_geometry;
  size_t end_local;
  size_t begin_local;
  mesh *mesh_local;
  scene *scene_local;
  
  local_90._0_4_ = SUBMESH_GEOMETRY;
  submesh_geometry.geometry.node._0_8_ = hash_submesh_geometry;
  submesh_geometry.geometry.node.hash = compare_submesh_geometry;
  submesh_geometry.geometry.node.compare = cleanup_submesh_geometry;
  submesh_geometry.geometry.node.cleanup = prepare_submesh_geometry;
  submesh_geometry.geometry.prepare = intersect_submesh_geometry_ray;
  submesh_geometry.geometry.intersect_ray = get_submesh_geometry_attr;
  submesh_geometry.geometry.get_attr = sample_submesh_geometry_surface;
  submesh_geometry.geometry.sample_surface = get_submesh_geometry_surface_area;
  submesh_geometry.end = 0;
  submesh_geometry.geometry.get_surface_area = (_func_real_t_geometry_t *)mesh;
  submesh_geometry.mesh = (mesh *)begin;
  submesh_geometry.begin = end;
  submesh_geometry.accel = (accel *)end;
  pgVar1 = (geometry_t)insert_scene_node(scene,(scene_node *)local_90,0x68);
  return pgVar1;
}

Assistant:

geometry_t new_submesh_geometry(struct scene* scene, const struct mesh* mesh, size_t begin, size_t end) {
    struct submesh_geometry submesh_geometry = {
        .geometry = {
            .node = {
                .type    = SUBMESH_GEOMETRY,
                .hash    = hash_submesh_geometry,
                .compare = compare_submesh_geometry,
                .cleanup = cleanup_submesh_geometry
            },
            .prepare          = prepare_submesh_geometry,
            .intersect_ray    = intersect_submesh_geometry_ray,
            .get_attr         = get_submesh_geometry_attr,
            .sample_surface   = sample_submesh_geometry_surface,
            .get_surface_area = get_submesh_geometry_surface_area
        },
        .mesh = mesh,
        .begin = begin,
        .end = end
    };
    return (geometry_t)insert_scene_node(scene,
        &submesh_geometry.geometry.node,
        sizeof(submesh_geometry));
}